

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.h
# Opt level: O3

string * __thiscall dynamicgraph::TracerRealTime::getClassName_abi_cxx11_(TracerRealTime *this)

{
  return &CLASS_NAME_abi_cxx11_;
}

Assistant:

class DG_TRACERREALTIME_DLLAPI TracerRealTime : public Tracer {
  DYNAMIC_GRAPH_ENTITY_DECL();

 public:
  TracerRealTime(const std::string &n);
  virtual ~TracerRealTime() {}

  virtual void closeFiles();
  virtual void trace();

  void display(std::ostream &os) const;
  DG_TRACERREALTIME_DLLAPI friend std::ostream &operator<<(
      std::ostream &os, const TracerRealTime &t);

  void emptyBuffers();

  void setBufferSize(const int &SIZE) { bufferSize = SIZE; }

  const int &getBufferSize() { return bufferSize; }

 protected:
  virtual void openFile(const SignalBase<int> &sig,
                        const std::string &filename);

  virtual void recordSignal(std::ostream &os, const SignalBase<int> &sig);

  typedef std::list<std::ofstream *> HardFileList;
  static const int BUFFER_SIZE_DEFAULT = 1048576;  //  1Mo

  int bufferSize;
  HardFileList hardFiles;
}